

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-abstract.h
# Opt level: O0

void __thiscall dynamicgraph::ExceptionAbstract::~ExceptionAbstract(ExceptionAbstract *this)

{
  ExceptionAbstract *this_local;
  
  *(undefined ***)this = &PTR__ExceptionAbstract_001690d8;
  std::__cxx11::string::~string((string *)&this->message);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

explicit ExceptionAbstract(const int &code, const std::string &msg = "");
  virtual ~ExceptionAbstract() throw() {}